

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::MultipleBindingCase
          (MultipleBindingCase *this,Context *ctx,char *name,int flags)

{
  ushort uVar1;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultipleBindingCase_021a6148;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"draw test pattern",0x11);
  if ((flags & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", zero stride",0xd);
  }
  if ((flags & 2U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", instanced binding point",0x19);
  }
  if ((flags & 4U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", binding points share buffer object",0x24);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  tcu::TestCase::TestCase((TestCase *)this,ctx->m_testCtx,name,(char *)local_1c8);
  (this->super_BindingRenderCase).super_TestCase.m_context = ctx;
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindingRenderCase_021a60f8;
  (this->super_BindingRenderCase).m_unalignedData = false;
  (this->super_BindingRenderCase).m_vao = 0;
  (this->super_BindingRenderCase).m_program = (ShaderProgram *)0x0;
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultipleBindingCase_021a6148;
  (this->m_spec).aliasingBuffers = (bool)((byte)flags >> 2 & 1);
  uVar1 = (ushort)flags & 1 | (ushort)((byte)flags >> 1 & 1) << 8;
  (this->m_spec).zeroStride = (bool)(char)uVar1;
  (this->m_spec).instanced = (bool)(char)(uVar1 >> 8);
  this->m_primitiveBuf = 0;
  this->m_colorOffsetBuf = 0;
  return;
}

Assistant:

MultipleBindingCase::MultipleBindingCase (Context& ctx, const char* name, int flags)
	: BindingRenderCase	(ctx, name, genTestDescription(flags).c_str(), false)
	, m_spec			(genTestSpec(flags))
	, m_primitiveBuf	(0)
	, m_colorOffsetBuf	(0)
{
	DE_ASSERT(!(m_spec.instanced && m_spec.zeroStride));
}